

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

void skipdata_opstr(char *opstr,uint8_t *buffer,size_t size)

{
  int iVar1;
  ulong in_RDX;
  byte *in_RSI;
  char *in_RDI;
  size_t available;
  size_t i;
  int len;
  char *p;
  size_t local_38;
  ulong local_30;
  char *local_20;
  
  if (in_RDX == 0) {
    *in_RDI = '\0';
  }
  else {
    iVar1 = cs_snprintf(in_RDI,0xa0,"0x%02x",(ulong)*in_RSI);
    local_20 = in_RDI + iVar1;
    local_30 = 1;
    for (local_38 = 0xa0 - (long)iVar1;
        ((local_30 < in_RDX &&
         (iVar1 = cs_snprintf(local_20,local_38,", 0x%02x",(ulong)in_RSI[local_30]), -1 < iVar1)) &&
        ((ulong)(long)iVar1 <= local_38 - 1)); local_38 = local_38 - (long)iVar1) {
      local_20 = local_20 + iVar1;
      local_30 = local_30 + 1;
    }
  }
  return;
}

Assistant:

static void skipdata_opstr(char *opstr, const uint8_t *buffer, size_t size)
{
	char *p = opstr;
	int len;
	size_t i;
	size_t available = sizeof(((cs_insn*)NULL)->op_str);

	if (!size) {
		opstr[0] = '\0';
		return;
	}

	len = cs_snprintf(p, available, "0x%02x", buffer[0]);
	p+= len;
	available -= len;

	for(i = 1; i < size; i++) {
		len = cs_snprintf(p, available, ", 0x%02x", buffer[i]);
		if (len < 0) {
			break;
		}
		if ((size_t)len > available - 1) {
			break;
		}
		p+= len;
		available -= len;
	}
}